

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall tcu::mix<4>(tcu *this,Vector<float,_4> *x,Vector<float,_4> *y,float a)

{
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar3;
  int local_28;
  int i;
  float a_local;
  Vector<float,_4> *y_local;
  Vector<float,_4> *x_local;
  Vector<float,_4> *res;
  undefined8 uVar2;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar2 = extraout_XMM0_Qa;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    in_XMM1_Qa = (ulong)(uint)y->m_data[local_28];
    fVar1 = deFloatMix(x->m_data[local_28],y->m_data[local_28],a);
    uVar2 = CONCAT44(extraout_XMM0_Db,fVar1);
    *(float *)(this + (long)local_28 * 4) = fVar1;
  }
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = (float)(int)uVar2;
  VVar3.m_data[1] = (float)(int)((ulong)uVar2 >> 0x20);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

Vector<float, Size> mix (const Vector<float, Size>& x, const Vector<float, Size>& y, float a)
{
	Vector<float, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = deFloatMix(x.m_data[i], y.m_data[i], a);
	return res;
}